

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_UpdateWitnessStack_Test::TestBody
          (cfdcapi_transaction_UpdateWitnessStack_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *message;
  char *in_R9;
  uint32_t in_stack_00000088;
  uint32_t in_stack_0000008c;
  char *in_stack_00000090;
  int in_stack_0000009c;
  void *in_stack_000000a0;
  void *in_stack_000000a8;
  char *in_stack_000000c0;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  char *str_buffer;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_3;
  char *tx_hex;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  void *tx_handle;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffc78;
  char *success;
  AssertionResult *in_stack_fffffffffffffc80;
  CfdErrorCode *in_stack_fffffffffffffc88;
  char *in_stack_fffffffffffffc90;
  AssertionResult *pAVar3;
  undefined7 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9f;
  void *in_stack_fffffffffffffcb8;
  char **in_stack_fffffffffffffd10;
  AssertionResult *in_stack_fffffffffffffd18;
  char *in_stack_fffffffffffffd50;
  AssertHelper local_270;
  Message local_268;
  undefined4 local_25c;
  AssertionResult local_258;
  AssertHelper local_248;
  Message local_240;
  AssertionResult local_238;
  AssertHelper local_228;
  Message local_220;
  undefined4 local_214;
  AssertionResult local_210;
  char *local_200;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined4 local_1e4;
  AssertionResult local_1e0;
  AssertHelper local_1d0;
  Message local_1c8;
  void **in_stack_fffffffffffffe40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe48;
  string local_1b0 [4];
  int in_stack_fffffffffffffe54;
  void *in_stack_fffffffffffffe58;
  AssertHelper local_190;
  Message local_188;
  undefined1 local_179;
  AssertionResult local_178;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_154;
  AssertionResult local_150;
  char *local_140;
  AssertHelper local_138;
  Message local_130;
  undefined4 local_124;
  AssertionResult local_120;
  string local_110;
  AssertHelper local_f0;
  Message local_e8;
  undefined1 local_d9;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  long local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98))
  ;
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
             in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,(int *)in_stack_fffffffffffffc80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3c85ea);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x3a4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3c864d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c86a2);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,(type *)0x3c86d6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(nullptr == handle)","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x3a5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3c87d2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c884d);
  local_a0 = 0;
  local_14 = CfdInitializeTxDataHandle
                       (in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                        (char *)in_stack_fffffffffffffe48.ptr_,in_stack_fffffffffffffe40);
  local_b4 = 0;
  pAVar3 = &local_b0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
             in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,(int *)in_stack_fffffffffffffc80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    in_stack_fffffffffffffd50 =
         testing::AssertionResult::failure_message((AssertionResult *)0x3c892b);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x3aa,in_stack_fffffffffffffd50);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x3c898e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c89e3);
  local_d9 = local_a0 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,(type *)0x3c8a17);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)&local_d8,(AssertionResult *)"(nullptr == tx_handle)","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x3ab,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    testing::Message::~Message((Message *)0x3c8b13);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c8b8e);
  if (local_14 == 0) {
    success = "02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef";
    pcVar2 = (char *)0x1;
    local_14 = CfdUpdateWitnessStack
                         (in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000090,
                          in_stack_0000008c,in_stack_00000088,in_stack_000000c0);
    local_124 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
               in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,(int *)in_stack_fffffffffffffc80)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
    if (!bVar1) {
      testing::Message::Message(&local_130);
      message = testing::AssertionResult::failure_message((AssertionResult *)0x3c8c85);
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x3af,message);
      testing::internal::AssertHelper::operator=(&local_138,&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      testing::Message::~Message((Message *)0x3c8ce8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c8d40);
    local_140 = (char *)0x0;
    local_14 = CfdFinalizeTransaction(in_stack_fffffffffffffc80,success,(char **)0x3c8d69);
    local_154 = 0;
    in_stack_fffffffffffffd18 = &local_150;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
               in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,(int *)in_stack_fffffffffffffc80)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffd18);
    if (!bVar1) {
      testing::Message::Message(&local_160);
      in_stack_fffffffffffffd10 =
           (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3c8e1d);
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x3b3,(char *)in_stack_fffffffffffffd10);
      testing::internal::AssertHelper::operator=(&local_168,&local_160);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      testing::Message::~Message((Message *)0x3c8e80);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c8ed5);
    local_179 = local_140 != (char *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffc80,(bool *)success,(type *)0x3c8f09);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
    if (!bVar1) {
      testing::Message::Message(&local_188);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1b0,(internal *)&local_178,(AssertionResult *)"(nullptr == tx_hex)"
                 ,"true","false",pcVar2);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x3b4,pcVar2);
      testing::internal::AssertHelper::operator=(&local_190,&local_188);
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      std::__cxx11::string::~string(local_1b0);
      testing::Message::~Message((Message *)0x3c9005);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c907d);
    if (local_140 != (char *)0x0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&stack0xfffffffffffffe40,
                 "\"02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f012102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef00000000\""
                 ,"tx_hex",
                 "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f012102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef00000000"
                 ,local_140);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffe40);
      if (!bVar1) {
        testing::Message::Message(&local_1c8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3c9127);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x3b6,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        testing::Message::~Message((Message *)0x3c9184);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c91d9);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffc88);
    }
    local_14 = CfdFreeTxDataHandle(pAVar3,in_stack_fffffffffffffd50);
    local_1e4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
               in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,(int *)in_stack_fffffffffffffc80)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
    if (!bVar1) {
      testing::Message::Message(&local_1f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3c92a5);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x3bb,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::Message::~Message((Message *)0x3c9302);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c9357);
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffcb8);
  if (local_14 != 0) {
    local_200 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    local_214 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
               in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,(int *)in_stack_fffffffffffffc80)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
    if (!bVar1) {
      testing::Message::Message(&local_220);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3c9444);
      testing::internal::AssertHelper::AssertHelper
                (&local_228,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x3c2,pcVar2);
      testing::internal::AssertHelper::operator=(&local_228,&local_220);
      testing::internal::AssertHelper::~AssertHelper(&local_228);
      testing::Message::~Message((Message *)0x3c94a1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c94f6);
    testing::internal::CmpHelperSTREQ((internal *)&local_238,"\"\"","str_buffer","",local_200);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
    if (!bVar1) {
      testing::Message::Message(&local_240);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3c958b);
      testing::internal::AssertHelper::AssertHelper
                (&local_248,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x3c3,pcVar2);
      testing::internal::AssertHelper::operator=(&local_248,&local_240);
      testing::internal::AssertHelper::~AssertHelper(&local_248);
      testing::Message::~Message((Message *)0x3c95e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c963d);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffc88);
    local_200 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffc88);
  local_25c = 0;
  pAVar3 = &local_258;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),&pAVar3->success_
             ,in_stack_fffffffffffffc88,(int *)in_stack_fffffffffffffc80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3c970d);
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x3c9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    testing::Message::~Message((Message *)0x3c976a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c97bf);
  return;
}

Assistant:

TEST(cfdcapi_transaction, UpdateWitnessStack) {
  static const char* const kTxHex = "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000";
  static const char* const kTxid = "31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3";
  static const uint32_t kVout = 0;

  void* handle = nullptr;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((nullptr == handle));

  void* tx_handle = nullptr;
  ret = CfdInitializeTxDataHandle(
      handle, kCfdNetworkMainnet, kTxHex, &tx_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((nullptr == tx_handle));
  if (ret == kCfdSuccess) {
    ret = CfdUpdateWitnessStack(handle, tx_handle, kCfdTxWitnessStackNormal,
        kTxid, kVout, 1, "02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef");
    EXPECT_EQ(kCfdSuccess, ret);

    char* tx_hex = nullptr;
    ret = CfdFinalizeTransaction(handle, tx_handle, &tx_hex);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_FALSE((nullptr == tx_hex));
    if (tx_hex != nullptr) {
      EXPECT_STREQ("02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f012102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef00000000", tx_hex);
      CfdFreeStringBuffer(tx_hex);
    }

    ret = CfdFreeTxDataHandle(handle, tx_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = nullptr;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = nullptr;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}